

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O1

void keccak_init(keccak_state *s,uint hashbits,uint ratebits,uchar first_pad_byte)

{
  uchar *puVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  if ((hashbits & 7) != 0) {
    __assert_fail("hashbits % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha3.c",
                  0x95,"void keccak_init(keccak_state *, unsigned int, unsigned int, unsigned char)"
                 );
  }
  if ((ratebits & 7) == 0) {
    s->hash_bytes = (ulong)(hashbits >> 3);
    uVar2 = 0x640 - ratebits >> 3;
    s->bytes_wanted = (ulong)uVar2;
    s->bytes_got = 0;
    s->first_pad_byte = first_pad_byte;
    if ((uVar2 & 7) == 0) {
      lVar3 = 0;
      do {
        lVar4 = -200;
        do {
          puVar1 = s->bytes + lVar4;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          lVar4 = lVar4 + 0x28;
        } while (lVar4 != 0);
        lVar3 = lVar3 + 1;
        s = (keccak_state *)(s->A[0] + 1);
      } while (lVar3 != 5);
      return;
    }
    __assert_fail("s->bytes_wanted % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha3.c",
                  0x9d,"void keccak_init(keccak_state *, unsigned int, unsigned int, unsigned char)"
                 );
  }
  __assert_fail("ratebits % 8 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha3.c",
                0x96,"void keccak_init(keccak_state *, unsigned int, unsigned int, unsigned char)");
}

Assistant:

static void keccak_init(keccak_state *s, unsigned hashbits, unsigned ratebits,
                        unsigned char first_pad_byte)
{
    int x, y;

    assert(hashbits % 8 == 0);
    assert(ratebits % 8 == 0);

    s->hash_bytes = hashbits / 8;
    s->bytes_wanted = (25 * 64 - ratebits) / 8;
    s->bytes_got = 0;
    s->first_pad_byte = first_pad_byte;

    assert(s->bytes_wanted % 8 == 0);

    for (y = 0; y < 5; y++)
        for (x = 0; x < 5; x++)
            s->A[x][y] = 0;
}